

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_k_means_test.cc
# Opt level: O2

void __thiscall
AV1Kmeans::AV1KmeansTest1::RunSpeedTest
          (AV1KmeansTest1 *this,av1_calc_indices_dim1_func test_impl,BLOCK_SIZE_conflict bsize,int k
          )

{
  code *pcVar1;
  double dVar2;
  double dVar3;
  ulong uVar4;
  int64_t iVar5;
  undefined7 in_register_00000011;
  long lVar6;
  int j;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  double elapsed_time [2];
  av1_calc_indices_dim1_func funcs [2];
  aom_usec_timer timer;
  double local_78 [2];
  code *local_68;
  av1_calc_indices_dim1_func local_60;
  aom_usec_timer local_50;
  
  uVar4 = CONCAT71(in_register_00000011,bsize) & 0xffffffff;
  uVar8 = (uint)::block_size_high[uVar4] * (uint)::block_size_wide[uVar4];
  local_68 = av1_calc_indices_dim1_c;
  local_78[0] = 0.0;
  local_78[1] = 0.0;
  uVar9 = (uint)(1000000000 / (ulong)uVar8);
  local_60 = test_impl;
  for (lVar6 = 0; dVar3 = local_78[1], dVar2 = local_78[0], lVar6 != 2; lVar6 = lVar6 + 1) {
    ::aom_usec_timer_start(&local_50);
    pcVar1 = (&local_68)[lVar6];
    for (uVar7 = 0; uVar7 < uVar9; uVar7 = uVar7 + 1) {
      (*pcVar1)(this->data_,this->centroids_,this->indices1_,0,uVar8,k);
    }
    ::aom_usec_timer_mark(&local_50);
    iVar5 = ::aom_usec_timer_elapsed(&local_50);
    local_78[lVar6] = ((double)iVar5 * 1000.0) / (double)uVar9;
  }
  printf("av1_calc_indices_dim1 indices= %d centroids=%d: %7.2f/%7.2fns",(ulong)uVar8,(ulong)(uint)k
        );
  printf("(%3.2f)\n",SUB84(dVar2 / dVar3,0));
  return;
}

Assistant:

void AV1KmeansTest1::RunSpeedTest(av1_calc_indices_dim1_func test_impl,
                                  BLOCK_SIZE bsize, int k) {
  const int w = block_size_wide[bsize];
  const int h = block_size_high[bsize];
  const int n = w * h;
  const int num_loops = 1000000000 / n;

  av1_calc_indices_dim1_func funcs[2] = { av1_calc_indices_dim1_c, test_impl };
  double elapsed_time[2] = { 0 };
  for (int i = 0; i < 2; ++i) {
    aom_usec_timer timer;
    aom_usec_timer_start(&timer);
    av1_calc_indices_dim1_func func = funcs[i];
    for (int j = 0; j < num_loops; ++j) {
      func(data_, centroids_, indices1_, /*total_dist=*/nullptr, n, k);
    }
    aom_usec_timer_mark(&timer);
    double time = static_cast<double>(aom_usec_timer_elapsed(&timer));
    elapsed_time[i] = 1000.0 * time / num_loops;
  }
  printf("av1_calc_indices_dim1 indices= %d centroids=%d: %7.2f/%7.2fns", n, k,
         elapsed_time[0], elapsed_time[1]);
  printf("(%3.2f)\n", elapsed_time[0] / elapsed_time[1]);
}